

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::UpdateRedeferralState(ThreadContext *this)

{
  RedeferralState RVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  uVar4 = GetRedeferralInactiveThreshold(this);
  uVar5 = GetRedeferralCollectionInterval(this);
  if (this->gcSinceCallCountsCollected < uVar4) {
    this->gcSinceCallCountsCollected = this->gcSinceCallCountsCollected + 1;
    this->gcSinceLastRedeferral = this->gcSinceLastRedeferral + 1;
  }
  else {
    this->gcSinceCallCountsCollected = 0;
    if (uVar5 <= this->gcSinceLastRedeferral) {
      RVar1 = this->redeferralState;
      if (RVar1 != MainRedeferralState) {
        if (RVar1 == StartupRedeferralState) {
          this->redeferralState = MainRedeferralState;
        }
        else if (RVar1 == InitialRedeferralState) {
          this->redeferralState = StartupRedeferralState;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xb4a,"(0)","0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
      }
      this->gcSinceLastRedeferral = 0;
    }
  }
  return;
}

Assistant:

void
ThreadContext::UpdateRedeferralState()
{
    uint inactiveThreshold = this->GetRedeferralInactiveThreshold();
    uint collectInterval = this->GetRedeferralCollectionInterval();

    if (this->gcSinceCallCountsCollected >= inactiveThreshold)
    {
        this->gcSinceCallCountsCollected = 0;
        if (this->gcSinceLastRedeferral >= collectInterval)
        {
            // Advance state
            switch (this->redeferralState)
            {
                case InitialRedeferralState:
                    this->redeferralState = StartupRedeferralState;
                    break;

                case StartupRedeferralState:
                    this->redeferralState = MainRedeferralState;
                    break;

                case MainRedeferralState:
                    break;

                default:
                    Assert(0);
                    break;
            }

            this->gcSinceLastRedeferral = 0;
        }
    }
    else
    {
        this->gcSinceCallCountsCollected++;
        this->gcSinceLastRedeferral++;
    }
}